

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamSequence.cpp
# Opt level: O0

void __thiscall BamTools::SamSequence::SamSequence(SamSequence *this,string *name,string *length)

{
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d [20];
  allocator local_19;
  string *local_18;
  string *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,"",&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI + 0x20,"",local_2d);
  std::allocator<char>::~allocator((allocator<char> *)local_2d);
  std::__cxx11::string::string(in_RDI + 0x40,local_18);
  std::__cxx11::string::string(in_RDI + 0x60,local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI + 0x80,"",&local_2e);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI + 0xa0,"",&local_2f);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f);
  std::vector<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>::vector
            ((vector<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_> *)
             0x19f01e);
  return;
}

Assistant:

SamSequence::SamSequence(const std::string& name,
                         const std::string& length)
    : AssemblyID("")
    , Checksum("")
    , Length(length)
    , Name(name)
    , Species("")
    , URI("")
{ }